

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pStateChangeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::anon_unknown_0::StateChangeCase::renderReference
          (StateChangeCase *this,Functions *gl)

{
  int local_20;
  int local_1c;
  int callNdx_1;
  int callNdx;
  Functions *gl_local;
  StateChangeCase *this_local;
  
  (*(this->super_StateChangePerformanceCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,gl,0);
  for (local_1c = 0; local_1c < (this->super_StateChangePerformanceCase).m_callCount;
      local_1c = local_1c + 1) {
    deqp::gls::StateChangePerformanceCase::callDraw(&this->super_StateChangePerformanceCase,gl);
  }
  (*(this->super_StateChangePerformanceCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,gl,1);
  for (local_20 = 0; local_20 < (this->super_StateChangePerformanceCase).m_callCount;
      local_20 = local_20 + 1) {
    deqp::gls::StateChangePerformanceCase::callDraw(&this->super_StateChangePerformanceCase,gl);
  }
  return;
}

Assistant:

void StateChangeCase::renderReference (const glw::Functions& gl)
{
	changeState(gl, 0);

	for (int callNdx = 0; callNdx < m_callCount; callNdx++)
		callDraw(gl);

	changeState(gl, 1);

	for (int callNdx = 0; callNdx < m_callCount; callNdx++)
		callDraw(gl);
}